

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribInitialCase::test
          (CurrentVertexAttribInitialCase *this)

{
  float index_00;
  qpTestResult qVar1;
  float (*pafVar2) [4];
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1c8;
  undefined1 local_48 [8];
  StateQueryMemoryWriteGuard<float[4]> attribValue;
  int index;
  int attribute_count;
  CurrentVertexAttribInitialCase *this_local;
  
  attribValue.m_postguard[3] = 2.24208e-44;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ApiCase).super_CallLogWrapper,0x8869,
             (GLint *)(attribValue.m_postguard + 3));
  attribValue.m_postguard[2] = 0.0;
  do {
    if ((int)attribValue.m_postguard[3] <= (int)attribValue.m_postguard[2]) {
      return;
    }
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<float[4]> *)local_48);
    index_00 = attribValue.m_postguard[2];
    pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
    glu::CallLogWrapper::glGetVertexAttribfv
              (&(this->super_ApiCase).super_CallLogWrapper,(GLuint)index_00,0x8626,*pafVar2);
    deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
              ((StateQueryMemoryWriteGuard<float[4]> *)local_48,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
    if (((*pafVar2)[0] != 0.0) || (NAN((*pafVar2)[0]))) {
LAB_01dd289a:
      this_00 = tcu::TestContext::getLog
                          ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
      tcu::TestLog::operator<<(&local_1c8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_1c8,(char (*) [33])"// ERROR: Expected [0, 0, 0, 1];");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [6])0x2b7b713);
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c5c975);
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2 + 1);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c5c975);
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2 + 2);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c5c975);
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*pafVar2 + 3);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29dc08e);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1c8);
      qVar1 = tcu::TestContext::getTestResult
                        ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                         m_testCtx);
      if (qVar1 == QP_TEST_RESULT_PASS) {
        tcu::TestContext::setTestResult
                  ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"got invalid attribute value");
      }
    }
    else {
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      if (((*pafVar2)[1] != 0.0) || (NAN((*pafVar2)[1]))) goto LAB_01dd289a;
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      if (((*pafVar2)[2] != 0.0) || (NAN((*pafVar2)[2]))) goto LAB_01dd289a;
      pafVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_48);
      if (((*pafVar2)[3] != 1.0) || (NAN((*pafVar2)[3]))) goto LAB_01dd289a;
    }
    attribValue.m_postguard[2] = (float)((int)attribValue.m_postguard[2] + 1);
  } while( true );
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// initial

		for (int index = 0; index < attribute_count; ++index)
		{
			StateQueryMemoryWriteGuard<GLfloat[4]> attribValue;
			glGetVertexAttribfv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);
			attribValue.verifyValidity(m_testCtx);

			if (attribValue[0] != 0.0f || attribValue[1] != 0.0f || attribValue[2] != 0.0f || attribValue[3] != 1.0f)
			{
				m_testCtx.getLog() << TestLog::Message
					<< "// ERROR: Expected [0, 0, 0, 1];"
					<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
					<< TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
			}
		}
	}